

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O0

gboolean postEventSourceDispatch(GSource *s,GSourceFunc param_2,gpointer param_3)

{
  int iVar1;
  QObject *in_RDI;
  GPostEventSource *source;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x8cffbf);
  *(int *)((long)&in_RDI[6]._vptr_QObject + 4) = iVar1;
  QCoreApplication::sendPostedEvents(in_RDI,in_stack_ffffffffffffffdc);
  QEventDispatcherGlibPrivate::runTimersOnceWithNormalPriority
            ((QEventDispatcherGlibPrivate *)in_RDI[6].d_ptr.d);
  return 1;
}

Assistant:

static gboolean postEventSourceDispatch(GSource *s, GSourceFunc, gpointer)
{
    GPostEventSource *source = reinterpret_cast<GPostEventSource *>(s);
    source->lastSerialNumber = source->serialNumber.loadRelaxed();
    QCoreApplication::sendPostedEvents();
    source->d->runTimersOnceWithNormalPriority();
    return true; // i dunno, george...
}